

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O1

Expression * __thiscall
wasm::SafeHeap::makeBoundsCheck
          (SafeHeap *this,Type type,Builder *builder,Index ptrLocal,Index sumLocal,Index bytes,
          Module *module,Type addressType,bool is64,Name memory)

{
  bool bVar1;
  Expression **ppEVar2;
  char *pcVar3;
  string_view target;
  Index IVar4;
  BinaryOp BVar5;
  Expression *pEVar6;
  Const *pCVar7;
  Binary *pBVar8;
  Binary *this_00;
  Expression *pEVar9;
  Binary *this_01;
  Call *pCVar10;
  Block *pBVar11;
  If *this_02;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  ulong uVar12;
  uint uVar13;
  BinaryOp BVar14;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type_;
  optional<wasm::Type> type_00;
  Const *local_80;
  SafeHeap *local_78;
  Load *local_70;
  Index local_68;
  BinaryOp local_64;
  Binary *local_60;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Index local_3c;
  allocator_type local_35;
  BinaryOp local_34;
  
  bVar1 = (((this->super_Pass).runner)->options).lowMemoryUnused;
  local_60 = (Binary *)(ulong)bVar1;
  local_64 = (uint)bVar1 + (uint)bVar1 * 2 + EqInt32;
  if (is64) {
    local_64 = (uint)bVar1 + (uint)bVar1 * 2 + EqInt64;
  }
  local_34 = bytes;
  local_78 = this;
  local_68 = ptrLocal;
  local_3c = sumLocal;
  if ((this->sbrk).super_IString.str._M_str == (char *)0x0) {
    if ((this->dynamicTopPtr).super_IString.str._M_str == (char *)0x0) {
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar10 = Builder::makeCall(builder,(Name)(this->getSbrkPtr).super_IString.str,&local_58,
                                  addressType,false);
      if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      ppEVar2 = (Expression **)(this->dynamicTopPtr).super_IString.str._M_len;
      pcVar3 = (this->dynamicTopPtr).super_IString.str._M_str;
      pCVar10 = (Call *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
      (pCVar10->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression._id =
           GlobalGetId;
      (pCVar10->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 0;
      (pCVar10->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .data = (Expression **)0x0;
      (pCVar10->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .data = ppEVar2;
      (pCVar10->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements = (size_t)pcVar3;
      (pCVar10->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
           addressType.id;
    }
    uVar13 = (uint)is64 * 4 + 4;
    local_70 = (Load *)MixedArena::allocSpace(&builder->wasm->allocator,0x48,8);
    (local_70->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    local_70->signed_ = false;
    (local_70->offset).addr = 0;
    (local_70->align).addr = 0;
    local_70->isAtomic = false;
    local_70->bytes = (uint8_t)uVar13;
    (local_70->offset).addr = 0;
    (local_70->align).addr = (ulong)uVar13;
    local_70->ptr = (Expression *)pCVar10;
    (local_70->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id =
         addressType.id;
    (local_70->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
    (local_70->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
    Load::finalize(local_70);
  }
  else {
    target = (this->sbrk).super_IString.str;
    local_80 = Builder::makeConstPtr(builder,0,addressType);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_80;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_58,__l,&local_35);
    local_70 = (Load *)Builder::makeCall(builder,(Name)target,&local_58,addressType,false);
    if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pEVar6 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  IVar4 = local_3c;
  pEVar6->_id = LocalGetId;
  *(Index *)(pEVar6 + 1) = local_3c;
  (pEVar6->type).id = addressType.id;
  pCVar7 = Builder::makeConstPtr(builder,((ulong)local_60 & 0xff) << 10,addressType);
  local_60 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (local_60->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (local_60->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  local_60->op = local_64;
  local_60->left = pEVar6;
  local_60->right = (Expression *)pCVar7;
  Binary::finalize(local_60);
  pEVar6 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar6->_id = LocalGetId;
  *(Index *)(pEVar6 + 1) = IVar4;
  (pEVar6->type).id = addressType.id;
  pCVar7 = Builder::makeConstPtr(builder,(ulong)local_34,addressType);
  pBVar8 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  BVar14 = GtUInt32;
  if (is64) {
    BVar14 = GtUInt64;
  }
  BVar5 = AddInt64;
  if (!is64) {
    BVar5 = AddInt32;
  }
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar8->op = BVar5;
  pBVar8->left = pEVar6;
  pBVar8->right = (Expression *)pCVar7;
  local_34 = LtUInt32;
  if (is64) {
    local_34 = LtUInt64;
  }
  Binary::finalize(pBVar8);
  this_00 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = BVar14;
  this_00->left = (Expression *)pBVar8;
  this_00->right = (Expression *)local_70;
  Binary::finalize(this_00);
  pEVar6 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar6->_id = LocalGetId;
  *(Index *)(pEVar6 + 1) = local_3c;
  (pEVar6->type).id = addressType.id;
  pEVar9 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar9->_id = LocalGetId;
  *(Index *)(pEVar9 + 1) = local_68;
  (pEVar9->type).id = addressType.id;
  pBVar8 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar8->op = local_34;
  pBVar8->left = pEVar6;
  pBVar8->right = pEVar9;
  Binary::finalize(pBVar8);
  this_01 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = OrInt32;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pBVar8;
  Binary::finalize(this_01);
  pBVar8 = (Binary *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar8->op = OrInt32;
  pBVar8->left = (Expression *)local_60;
  pBVar8->right = (Expression *)this_01;
  Binary::finalize(pBVar8);
  args = &local_58;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar10 = Builder::makeCall(builder,(Name)(local_78->segfault).super_IString.str,args,(Type)0x0,
                              false);
  pEVar6 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x10,8);
  pEVar6->_id = UnreachableId;
  (pEVar6->type).id = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)args;
  pBVar11 = Builder::makeSequence(builder,(Expression *)pCVar10,pEVar6,type_00);
  uVar12 = 0x28;
  this_02 = (If *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  this_02->ifFalse = (Expression *)0x0;
  this_02->condition = (Expression *)pBVar8;
  this_02->ifTrue = (Expression *)pBVar11;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar12;
  If::finalize(this_02,type_);
  if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)this_02;
}

Assistant:

Expression* makeBoundsCheck(Type type,
                              Builder& builder,
                              Index ptrLocal,
                              Index sumLocal,
                              Index bytes,
                              Module* module,
                              Type addressType,
                              bool is64,
                              Name memory) {
    bool lowMemUnused = getPassOptions().lowMemoryUnused;
    auto upperOp = is64 ? lowMemUnused ? LtUInt64 : EqInt64
                        : lowMemUnused ? LtUInt32 : EqInt32;
    auto upperBound = lowMemUnused ? PassOptions::LowMemoryBound : 0;
    Expression* brkLocation;
    if (sbrk.is()) {
      brkLocation = builder.makeCall(
        sbrk, {builder.makeConstPtr(0, addressType)}, addressType);
    } else {
      Expression* sbrkPtr;
      if (dynamicTopPtr.is()) {
        sbrkPtr = builder.makeGlobalGet(dynamicTopPtr, addressType);
      } else {
        sbrkPtr = builder.makeCall(getSbrkPtr, {}, addressType);
      }
      auto size = is64 ? 8 : 4;
      brkLocation =
        builder.makeLoad(size, false, 0, size, sbrkPtr, addressType, memory);
    }
    auto gtuOp = is64 ? GtUInt64 : GtUInt32;
    auto addOp = is64 ? AddInt64 : AddInt32;
    auto* upperCheck =
      builder.makeBinary(upperOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(upperBound, addressType));
    auto* lowerCheck = builder.makeBinary(
      gtuOp,
      builder.makeBinary(addOp,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeConstPtr(bytes, addressType)),
      brkLocation);
    // Check for an overflow when adding the pointer and the size, using the
    // rule that for any unsigned x and y,
    //    x + y < x    <=>   x + y overflows
    auto* overflowCheck =
      builder.makeBinary(is64 ? LtUInt64 : LtUInt32,
                         builder.makeLocalGet(sumLocal, addressType),
                         builder.makeLocalGet(ptrLocal, addressType));
    // Add an unreachable right after the call to segfault for performance
    // reasons: the call never returns, and this helps optimizations benefit
    // from that.
    return builder.makeIf(
      builder.makeBinary(
        OrInt32,
        upperCheck,
        builder.makeBinary(OrInt32, lowerCheck, overflowCheck)),
      builder.makeSequence(builder.makeCall(segfault, {}, Type::none),
                           builder.makeUnreachable()));
  }